

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ConcurrentDatabase::write_entry
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t blob_size,
          PayloadWriteFlags flags)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  char *path;
  DatabaseInterface *__p;
  pointer pDVar5;
  byte local_c9;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string write_path;
  uint index;
  PayloadWriteFlags flags_local;
  size_t blob_size_local;
  void *blob_local;
  Hash hash_local;
  ConcurrentDatabase *pCStack_18;
  ResourceTag tag_local;
  ConcurrentDatabase *this_local;
  
  if (((this->mode == Append) || (this->mode == AppendWithReadOnlyAccess)) ||
     (this->mode == OverWrite)) {
    write_path.field_2._12_4_ = flags;
    blob_local = (void *)hash;
    hash_local._4_4_ = tag;
    pCStack_18 = this;
    sVar4 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(this->primed_hashes + tag,(key_type *)&blob_local);
    if (sVar4 == 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
      if (bVar1) {
        pDVar5 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&this->readonly_interface);
        uVar2 = (*pDVar5->_vptr_DatabaseInterface[5])(pDVar5,(ulong)hash_local._4_4_,blob_local);
        if ((uVar2 & 1) != 0) {
          return true;
        }
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->writeonly_interface);
      if (bVar1) {
        pDVar5 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&this->writeonly_interface);
        uVar2 = (*pDVar5->_vptr_DatabaseInterface[5])(pDVar5,(ulong)hash_local._4_4_,blob_local);
        if ((uVar2 & 1) != 0) {
          return true;
        }
      }
      if ((this->need_writeonly_database & 1U) != 0) {
        write_path.field_2._8_4_ = 1;
        while( true ) {
          local_c9 = 0;
          if ((uint)write_path.field_2._8_4_ < 0x100) {
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->writeonly_interface)
            ;
            local_c9 = bVar1 ^ 0xff;
          }
          if ((local_c9 & 1) == 0) break;
          std::operator+(&local_a0,&this->base_path,".");
          std::__cxx11::to_string(&local_c0,write_path.field_2._8_4_);
          std::operator+(&local_80,&local_a0,&local_c0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60,&local_80,".foz");
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_a0);
          path = (char *)std::__cxx11::string::c_str();
          __p = create_stream_archive_database(path,ExclusiveOverWrite);
          std::
          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          ::reset(&this->writeonly_interface,__p);
          pDVar5 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator->(&this->writeonly_interface);
          uVar2 = (*pDVar5->_vptr_DatabaseInterface[2])();
          if ((uVar2 & 1) == 0) {
            std::
            unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ::reset(&this->writeonly_interface,(pointer)0x0);
          }
          std::__cxx11::string::~string((string *)local_60);
          write_path.field_2._8_4_ = write_path.field_2._8_4_ + 1;
        }
        this->need_writeonly_database = false;
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->writeonly_interface);
      if (bVar1) {
        pDVar5 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&this->writeonly_interface);
        iVar3 = (*pDVar5->_vptr_DatabaseInterface[4])
                          (pDVar5,(ulong)hash_local._4_4_,blob_local,blob,blob_size,
                           (ulong)(uint)write_path.field_2._12_4_);
        this_local._7_1_ = (bool)((byte)iVar3 & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t blob_size, PayloadWriteFlags flags) override
	{
		if (mode != DatabaseMode::Append &&
		    mode != DatabaseMode::AppendWithReadOnlyAccess &&
		    mode != DatabaseMode::OverWrite)
			return false;

		if (primed_hashes[tag].count(hash))
			return true;

		// All threads must have called prepare and synchronized readonly_interface from that,
		// and from here on out readonly_interface is purely read-only, no need to lock just to check.
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return true;

		if (writeonly_interface && writeonly_interface->has_entry(tag, hash))
			return true;

		if (need_writeonly_database)
		{
			// Lazily create a new database. Open the database file exclusively to work concurrently with other processes.
			// Don't try forever.
			for (unsigned index = 1; index < 256 && !writeonly_interface; index++)
			{
				std::string write_path = base_path + "." + std::to_string(index) + ".foz";
				writeonly_interface.reset(create_stream_archive_database(write_path.c_str(), DatabaseMode::ExclusiveOverWrite));
				if (!writeonly_interface->prepare())
					writeonly_interface.reset();
			}

			need_writeonly_database = false;
		}

		if (writeonly_interface)
			return writeonly_interface->write_entry(tag, hash, blob, blob_size, flags);
		else
			return false;
	}